

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

int __thiscall MlmWrap::setProducer(MlmWrap *this,char *stream)

{
  int iVar1;
  ostream *poVar2;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = mlm_client_set_producer(this->client);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_40,"Could not set producer for ",&local_81);
    std::operator+(&local_80,&local_40,stream);
    error(&local_60,this,&local_80);
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_60);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return iVar1;
}

Assistant:

int MlmWrap::setProducer(const char *stream){
    int rc = mlm_client_set_producer(client, stream);
    if(rc){
        std::cerr << error(std::string("Could not set producer for ") + stream) << std::endl;
    }
    return rc;
}